

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ym2203_write(void *chip,UINT8 a,UINT8 v)

{
  byte bVar1;
  FM_OPN *OPN_00;
  undefined7 uVar2;
  UINT8 addr;
  FM_OPN *OPN;
  YM2203 *F2203;
  UINT8 v_local;
  UINT8 a_local;
  void *chip_local;
  
  OPN_00 = (FM_OPN *)((long)chip + 0x108);
  uVar2 = (undefined7)((ulong)OPN_00 >> 8);
  if ((a & 1) == 0) {
    *(UINT8 *)((long)chip + 300) = v;
    if (v < 0x10) {
      (**(code **)((long)chip + 0x560))(*(undefined8 *)((long)chip + 0x578),a,v,CONCAT71(uVar2,a));
    }
    if ((0x2c < v) && (v < 0x30)) {
      OPNPrescaler_w(OPN_00,(uint)v,1);
    }
  }
  else {
    bVar1 = *(byte *)((long)chip + 300);
    *(UINT8 *)((long)chip + (ulong)bVar1 + 8) = v;
    if ((bVar1 & 0xf0) == 0) {
      (**(code **)((long)chip + 0x560))(*(undefined8 *)((long)chip + 0x578),a,v,CONCAT71(uVar2,a));
    }
    else if ((bVar1 & 0xf0) == 0x20) {
      ym2203_update_req(chip);
      OPNWriteMode(OPN_00,(uint)bVar1,(uint)v);
    }
    else {
      ym2203_update_req(chip);
      OPNWriteReg(OPN_00,(uint)bVar1,(uint)v);
    }
  }
  return;
}

Assistant:

void ym2203_write(void *chip,UINT8 a,UINT8 v)
{
	YM2203 *F2203 = (YM2203 *)chip;
	FM_OPN *OPN = &F2203->OPN;

	if( !(a&1) )
	{   /* address port */
		OPN->ST.address = v;

		/* Write register to SSG emulator */
		if( v < 16 ) OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);

		/* prescaler select : 2d,2e,2f  */
		if( v >= 0x2d && v <= 0x2f )
			OPNPrescaler_w(OPN , v , 1);
	}
	else
	{   /* data port */
		UINT8 addr = OPN->ST.address;
		F2203->REGS[addr] = v;
		switch( addr & 0xf0 )
		{
		case 0x00:  /* 0x00-0x0f : SSG section */
			/* Write data to SSG emulator */
			OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
			break;
		case 0x20:  /* 0x20-0x2f : Mode section */
			ym2203_update_req(F2203);
			/* write register */
			OPNWriteMode(OPN,addr,v);
			break;
		default:    /* 0x30-0xff : OPN section */
			ym2203_update_req(F2203);
			/* write register */
			OPNWriteReg(OPN,addr,v);
		}
		FM_BUSY_SET(&OPN->ST,1);
	}
	//return OPN->ST.irq;
	return;
}